

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaTreeItemPtr_conflict
xmlSchemaParseModelGroup
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node,xmlSchemaTypeType type,
          int withParticle)

{
  xmlSchemaRedefPtr_conflict pxVar1;
  _xmlNode *namespaceName;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint min;
  xmlSchemaParticlePtr pxVar5;
  xmlSchemaAnnotPtr pxVar6;
  xmlSchemaTreeItemPtr_conflict pxVar7;
  xmlSchemaTreeItemPtr *ppxVar8;
  xmlSchemaParticlePtr pxVar9;
  xmlSchemaPtr schema_00;
  bool bVar10;
  int *isElemRef_00;
  xmlNodePtr node_00;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaBasicItemPtr extraout_RDX_03;
  xmlSchemaBasicItemPtr extraout_RDX_04;
  xmlSchemaBasicItemPtr extraout_RDX_05;
  xmlSchemaBasicItemPtr extraout_RDX_06;
  xmlSchemaBasicItemPtr extraout_RDX_07;
  xmlSchemaBasicItemPtr extraout_RDX_08;
  xmlSchemaBasicItemPtr extraout_RDX_09;
  xmlSchemaBasicItemPtr extraout_RDX_10;
  xmlSchemaBasicItemPtr pxVar11;
  xmlSchemaBasicItemPtr extraout_RDX_11;
  xmlSchemaBasicItemPtr extraout_RDX_12;
  xmlSchemaBasicItemPtr extraout_RDX_13;
  xmlSchemaBasicItemPtr extraout_RDX_14;
  xmlSchemaBasicItemPtr extraout_RDX_15;
  xmlSchemaBasicItemPtr extraout_RDX_16;
  _xmlNode *node_01;
  char *in_R9;
  char *pcVar12;
  xmlSchemaTreeItemPtr_conflict *ppxVar13;
  xmlSchemaTreeItemPtr_conflict pxVar14;
  _xmlAttr *p_Var15;
  _xmlNode *p_Var16;
  int isElemRef;
  char *in_stack_ffffffffffffff68;
  uint local_68;
  int local_64;
  xmlSchemaAnnotPtr local_60;
  xmlSchemaParticlePtr local_58;
  xmlSchemaParticlePtr local_50;
  xmlChar *local_48;
  uint local_40;
  uint local_3c;
  xmlSchemaPtr local_38;
  
  if (node == (xmlNodePtr)0x0) {
    return (xmlSchemaTreeItemPtr_conflict)0x0;
  }
  node_00 = node;
  iVar3 = withParticle;
  pxVar5 = (xmlSchemaParticlePtr)xmlSchemaAddModelGroup(ctxt,schema,type,node);
  if (pxVar5 != (xmlSchemaParticlePtr)0x0) {
    if (withParticle == 0) {
      p_Var15 = node->properties;
      local_40 = 1;
      pxVar11 = extraout_RDX;
      for (; local_50 = pxVar5, p_Var15 != (_xmlAttr *)0x0; p_Var15 = p_Var15->next) {
        if (p_Var15->ns == (xmlNs *)0x0) {
          iVar3 = xmlStrEqual(p_Var15->name,"id");
          pxVar11 = extraout_RDX_02;
          if (iVar3 == 0) goto LAB_001975d9;
        }
        else {
          iVar3 = xmlStrEqual(p_Var15->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
          pxVar11 = extraout_RDX_00;
          if (iVar3 != 0) {
LAB_001975d9:
            xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var15,pxVar11,(xmlAttrPtr)node_00);
            pxVar11 = extraout_RDX_01;
          }
        }
        pxVar5 = local_50;
      }
      local_68 = 1;
      local_58 = pxVar5;
    }
    else {
      local_50 = pxVar5;
      if (type != XML_SCHEMA_TYPE_ALL) {
        uVar2 = xmlGetMinOccurs(ctxt,node,-1,0x1e085f,iVar3,in_R9);
        iVar4 = 0x1e0875;
        iVar3 = 0x40000000;
      }
      else {
        uVar2 = xmlGetMinOccurs(ctxt,node,1,0x1e0857,iVar3,in_R9);
        iVar4 = 0x1c869a;
        iVar3 = 1;
      }
      local_68 = xmlGetMaxOccurs(ctxt,node,(uint)(type == XML_SCHEMA_TYPE_ALL),iVar3,iVar4,in_R9);
      xmlSchemaPCheckParticleCorrect_2
                (ctxt,(xmlSchemaParticlePtr)node,(xmlNodePtr)(ulong)uVar2,local_68,iVar4);
      node_00 = (xmlNodePtr)(ulong)local_68;
      local_58 = xmlSchemaAddParticle(ctxt,node,uVar2,local_68);
      if (local_58 == (xmlSchemaParticlePtr)0x0) {
        return (xmlSchemaTreeItemPtr_conflict)0x0;
      }
      local_58->children = (xmlSchemaTreeItemPtr_conflict)pxVar5;
      pxVar11 = extraout_RDX_03;
      local_40 = uVar2;
      for (p_Var15 = node->properties; p_Var15 != (_xmlAttr *)0x0; p_Var15 = p_Var15->next) {
        if (p_Var15->ns == (xmlNs *)0x0) {
          iVar3 = xmlStrEqual(p_Var15->name,"id");
          pxVar11 = extraout_RDX_06;
          if (((iVar3 == 0) &&
              (iVar3 = xmlStrEqual(p_Var15->name,(xmlChar *)"maxOccurs"), pxVar11 = extraout_RDX_07,
              iVar3 == 0)) &&
             (iVar3 = xmlStrEqual(p_Var15->name,(xmlChar *)"minOccurs"), pxVar11 = extraout_RDX_08,
             iVar3 == 0)) goto LAB_001976c4;
        }
        else {
          iVar3 = xmlStrEqual(p_Var15->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
          pxVar11 = extraout_RDX_04;
          if (iVar3 != 0) {
LAB_001976c4:
            xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var15,pxVar11,(xmlAttrPtr)node_00);
            pxVar11 = extraout_RDX_05;
          }
        }
        pxVar5 = local_50;
      }
    }
    xmlSchemaPValAttrID(ctxt,node,(xmlChar *)pxVar11);
    node_01 = node->children;
    if (node_01 == (xmlNodePtr)0x0) {
      iVar3 = 0;
    }
    else {
      if (((node_01->ns != (xmlNs *)0x0) &&
          (iVar3 = xmlStrEqual(node_01->name,(xmlChar *)"annotation"), iVar3 != 0)) &&
         (iVar3 = xmlStrEqual(node_01->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
         iVar3 != 0)) {
        pxVar6 = xmlSchemaParseAnnotation(ctxt,node_01,1);
        pxVar5->annot = pxVar6;
        node_01 = node_01->next;
      }
      iVar3 = 0;
      if (type == XML_SCHEMA_TYPE_ALL) {
        if (node_01 != (xmlNodePtr)0x0) {
          ppxVar13 = &local_50->children;
          pxVar14 = (xmlSchemaTreeItemPtr_conflict)0x0;
          iVar3 = 0;
LAB_001977cd:
          if (((node_01->ns != (xmlNs *)0x0) &&
              (iVar4 = xmlStrEqual(node_01->name,"element"), iVar4 != 0)) &&
             (iVar4 = xmlStrEqual(node_01->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
             iVar4 != 0)) goto code_r0x0019780c;
          pcVar12 = "(annotation?, (annotation?, element*)";
LAB_00197f10:
          xmlSchemaPContentErr
                    (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,node_01,
                     (xmlNodePtr)0x0,pcVar12,in_stack_ffffffffffffff68);
        }
      }
      else if (node_01 != (xmlNodePtr)0x0) {
        ppxVar13 = &local_50->children;
        pxVar5 = (xmlSchemaParticlePtr)0x0;
        pxVar9 = (xmlSchemaParticlePtr)0x0;
        iVar3 = 0;
        do {
          if ((node_01->ns == (xmlNs *)0x0) ||
             (((iVar4 = xmlStrEqual(node_01->name,"element"), iVar4 == 0 ||
               (iVar4 = xmlStrEqual(node_01->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar4 == 0)) &&
              ((node_01->ns == (xmlNs *)0x0 ||
               (((iVar4 = xmlStrEqual(node_01->name,"group"), iVar4 == 0 ||
                 (iVar4 = xmlStrEqual(node_01->ns->href,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar4 == 0))
                && ((node_01->ns == (xmlNs *)0x0 ||
                    (((iVar4 = xmlStrEqual(node_01->name,"any"), iVar4 == 0 ||
                      (iVar4 = xmlStrEqual(node_01->ns->href,
                                           (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                      iVar4 == 0)) &&
                     ((node_01->ns == (xmlNs *)0x0 ||
                      (((iVar4 = xmlStrEqual(node_01->name,(xmlChar *)"choice"), iVar4 == 0 ||
                        (iVar4 = xmlStrEqual(node_01->ns->href,
                                             (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                        iVar4 == 0)) &&
                       ((node_01->ns == (xmlNs *)0x0 ||
                        ((iVar4 = xmlStrEqual(node_01->name,(xmlChar *)"sequence"), iVar4 == 0 ||
                         (iVar4 = xmlStrEqual(node_01->ns->href,
                                              (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                         iVar4 == 0)))))))))))))))))))) {
            pcVar12 = "(annotation?, (element | group | choice | sequence | any)*)";
            goto LAB_00197f10;
          }
          if (node_01->ns == (xmlNs *)0x0) {
LAB_00197df8:
            if (pxVar9 != (xmlSchemaParticlePtr)0x0) goto LAB_00197dfd;
LAB_00197e77:
            pxVar9 = (xmlSchemaParticlePtr)0x0;
          }
          else {
            iVar4 = xmlStrEqual(node_01->name,"element");
            if ((iVar4 != 0) &&
               (iVar4 = xmlStrEqual(node_01->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar4 != 0)) {
              isElemRef_00 = &local_64;
              pxVar9 = (xmlSchemaParticlePtr)
                       xmlSchemaParseElement(ctxt,schema,node_01,isElemRef_00,0);
              bVar10 = local_64 != 0 && pxVar9 != (xmlSchemaParticlePtr)0x0;
              node_00 = (xmlNodePtr)CONCAT71((int7)((ulong)isElemRef_00 >> 8),bVar10);
              iVar3 = iVar3 + (uint)bVar10;
              goto LAB_00197df8;
            }
            if (node_01->ns == (xmlNs *)0x0) goto LAB_00197df8;
            iVar4 = xmlStrEqual(node_01->name,"group");
            if ((iVar4 == 0) ||
               (iVar4 = xmlStrEqual(node_01->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar4 == 0)) {
              if (node_01->ns == (xmlNs *)0x0) goto LAB_00197df8;
              iVar4 = xmlStrEqual(node_01->name,"any");
              if ((iVar4 == 0) ||
                 (iVar4 = xmlStrEqual(node_01->ns->href,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar4 == 0)) {
                if (node_01->ns != (xmlNs *)0x0) {
                  iVar4 = xmlStrEqual(node_01->name,(xmlChar *)"choice");
                  if ((iVar4 == 0) ||
                     (iVar4 = xmlStrEqual(node_01->ns->href,
                                          (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar4 == 0
                     )) {
                    if ((node_01->ns == (xmlNs *)0x0) ||
                       ((iVar4 = xmlStrEqual(node_01->name,(xmlChar *)"sequence"), iVar4 == 0 ||
                        (iVar4 = xmlStrEqual(node_01->ns->href,
                                             (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                        iVar4 == 0)))) goto LAB_00197df8;
                    node_00 = (xmlNodePtr)0x6;
                  }
                  else {
                    node_00 = (xmlNodePtr)0x7;
                  }
                  pxVar9 = (xmlSchemaParticlePtr)
                           xmlSchemaParseModelGroup
                                     (ctxt,schema,node_01,(xmlSchemaTypeType)node_00,1);
                }
                goto LAB_00197df8;
              }
              pxVar11 = extraout_RDX_09;
              for (p_Var15 = node_01->properties; p_Var15 != (_xmlAttr *)0x0;
                  p_Var15 = p_Var15->next) {
                if (p_Var15->ns == (xmlNs *)0x0) {
                  iVar4 = xmlStrEqual(p_Var15->name,"id");
                  pxVar11 = extraout_RDX_12;
                  if ((((iVar4 == 0) &&
                       (iVar4 = xmlStrEqual(p_Var15->name,(xmlChar *)"minOccurs"),
                       pxVar11 = extraout_RDX_13, iVar4 == 0)) &&
                      (iVar4 = xmlStrEqual(p_Var15->name,(xmlChar *)"maxOccurs"),
                      pxVar11 = extraout_RDX_14, iVar4 == 0)) &&
                     ((iVar4 = xmlStrEqual(p_Var15->name,"namespace"), pxVar11 = extraout_RDX_15,
                      iVar4 == 0 &&
                      (iVar4 = xmlStrEqual(p_Var15->name,(xmlChar *)"processContents"),
                      pxVar11 = extraout_RDX_16, iVar4 == 0)))) goto LAB_00197be2;
                }
                else {
                  iVar4 = xmlStrEqual(p_Var15->ns->href,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema");
                  pxVar11 = extraout_RDX_10;
                  if (iVar4 != 0) {
LAB_00197be2:
                    xmlSchemaPIllegalAttrErr
                              (ctxt,(xmlParserErrors)p_Var15,pxVar11,(xmlAttrPtr)node_00);
                    pxVar11 = extraout_RDX_11;
                  }
                }
              }
              xmlSchemaPValAttrID(ctxt,node_01,(xmlChar *)pxVar11);
              iVar4 = 0x1e0875;
              uVar2 = xmlGetMaxOccurs(ctxt,node_01,0,0x40000000,0x1e0875,in_R9);
              min = xmlGetMinOccurs(ctxt,node_01,-1,0x1e085f,iVar4,in_R9);
              xmlSchemaPCheckParticleCorrect_2
                        (ctxt,(xmlSchemaParticlePtr)node_01,(xmlNodePtr)(ulong)min,uVar2,iVar4);
              node_00 = node_01;
              schema_00 = (xmlSchemaPtr)
                          xmlSchemaAddWildcard(ctxt,schema,XML_SCHEMA_TYPE_ANY,node_01);
              if (schema_00 != (xmlSchemaPtr)0x0) {
                local_3c = uVar2;
                local_38 = schema_00;
                xmlSchemaParseWildcardNs(ctxt,schema_00,(xmlSchemaWildcardPtr)node_01,node_00);
                p_Var16 = node_01->children;
                if (p_Var16 == (xmlNodePtr)0x0) {
                  local_60 = (xmlSchemaAnnotPtr)0x0;
                }
                else {
                  if (((p_Var16->ns == (xmlNs *)0x0) ||
                      (iVar4 = xmlStrEqual(p_Var16->name,(xmlChar *)"annotation"), iVar4 == 0)) ||
                     (iVar4 = xmlStrEqual(p_Var16->ns->href,
                                          (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar4 == 0
                     )) {
                    local_60 = (xmlSchemaAnnotPtr)0x0;
                  }
                  else {
                    local_60 = xmlSchemaParseAnnotation(ctxt,p_Var16,1);
                    p_Var16 = p_Var16->next;
                    if (p_Var16 == (_xmlNode *)0x0) goto LAB_00197e42;
                  }
                  in_R9 = "(annotation?)";
                  xmlSchemaPContentErr
                            (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node_01,
                             p_Var16,(xmlNodePtr)0x0,"(annotation?)",in_stack_ffffffffffffff68);
                }
LAB_00197e42:
                node_00 = (xmlNodePtr)(ulong)local_3c;
                if ((min != 0 || local_3c != 0) &&
                   (pxVar9 = xmlSchemaAddParticle(ctxt,node_01,min,local_3c),
                   pxVar9 != (xmlSchemaParticlePtr)0x0)) {
                  pxVar9->annot = local_60;
                  pxVar9->children = (xmlSchemaTreeItemPtr_conflict)local_38;
                  goto LAB_00197dfd;
                }
              }
              goto LAB_00197e77;
            }
            pxVar9 = (xmlSchemaParticlePtr)xmlSchemaParseModelGroupDefRef(ctxt,schema,node_01);
            iVar3 = (iVar3 + 1) - (uint)(pxVar9 == (xmlSchemaParticlePtr)0x0);
            if ((((ctxt->isRedefine == 0) ||
                 (pxVar1 = ctxt->redef, pxVar1 == (xmlSchemaRedefPtr_conflict)0x0)) ||
                (pxVar9 == (xmlSchemaParticlePtr)0x0)) ||
               (node_00 = (xmlNodePtr)pxVar1->item,
               *(xmlSchemaTypeType *)&node_00->_private != XML_SCHEMA_TYPE_GROUP))
            goto LAB_00197df8;
            node_00 = (xmlNodePtr)pxVar9->children;
            if (((node_00 != (xmlNodePtr)0x0) &&
                (p_Var16 = (_xmlNode *)pxVar1->refName, node_00->children == p_Var16)) &&
               (namespaceName = (_xmlNode *)pxVar1->refTargetNs, node_00->last == namespaceName)) {
              if (ctxt->redefCounter == 0) {
                if ((pxVar9->minOccurs != 1) || (pxVar9->maxOccurs != 1)) {
                  local_48 = (xmlChar *)0x0;
                  in_R9 = (char *)xmlSchemaFormatQName
                                            (&local_48,(xmlChar *)namespaceName,(xmlChar *)p_Var16);
                  pcVar12 = 
                  "The redefining model group definition \'%s\' must not contain a reference to the redefined definition with a maxOccurs/minOccurs other than 1"
                  ;
                  goto LAB_00197ecc;
                }
              }
              else {
                local_48 = (xmlChar *)0x0;
                in_R9 = (char *)xmlSchemaFormatQName
                                          (&local_48,(xmlChar *)namespaceName,(xmlChar *)p_Var16);
                pcVar12 = 
                "The redefining model group definition \'%s\' must not contain more than one reference to the redefined definition"
                ;
LAB_00197ecc:
                in_stack_ffffffffffffff68 = (char *)0x0;
                node_00 = (xmlNodePtr)0x0;
                xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_SRC_REDEFINE,node_01,
                                    (xmlSchemaBasicItemPtr)0x0,pcVar12,(xmlChar *)in_R9,
                                    (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
                if (local_48 != (xmlChar *)0x0) {
                  (*xmlFree)(local_48);
                }
                pxVar9 = (xmlSchemaParticlePtr)0x0;
              }
              ctxt->redef->reference = (xmlSchemaBasicItemPtr)pxVar9;
              ctxt->redefCounter = ctxt->redefCounter + 1;
              goto LAB_00197df8;
            }
LAB_00197dfd:
            ppxVar8 = &pxVar5->next;
            if (pxVar5 == (xmlSchemaParticlePtr)0x0) {
              ppxVar8 = ppxVar13;
            }
            *ppxVar8 = (xmlSchemaTreeItemPtr)pxVar9;
            pxVar5 = pxVar9;
          }
          node_01 = node_01->next;
        } while (node_01 != (_xmlNode *)0x0);
      }
    }
LAB_00197f26:
    if (local_68 != 0 || local_40 != 0) {
      if (iVar3 == 0) {
        return (xmlSchemaTreeItemPtr_conflict)local_58;
      }
      iVar3 = xmlSchemaAddItemSize(&ctxt->constructor->pending,10,local_50);
      if (iVar3 < 0) {
        ctxt->nberrors = ctxt->nberrors + 1;
        ctxt->err = 2;
        xmlRaiseMemoryError(ctxt->serror,ctxt->error,ctxt->errCtxt,0x10,(xmlError *)0x0);
        return (xmlSchemaTreeItemPtr_conflict)local_58;
      }
      return (xmlSchemaTreeItemPtr_conflict)local_58;
    }
  }
  return (xmlSchemaTreeItemPtr_conflict)0x0;
code_r0x0019780c:
  pxVar7 = (xmlSchemaTreeItemPtr_conflict)xmlSchemaParseElement(ctxt,schema,node_01,&local_64,0);
  if (pxVar7 != (xmlSchemaTreeItemPtr_conflict)0x0) {
    iVar3 = (iVar3 + 1) - (uint)(local_64 == 0);
    if (1 < (int)pxVar7[1].type) {
      in_stack_ffffffffffffff68 = (char *)0x0;
      xmlSchemaPCustomErrExt
                (ctxt,XML_SCHEMAP_COS_ALL_LIMITED,(xmlSchemaBasicItemPtr)0x0,node_01,
                 "Invalid value for minOccurs (must be 0 or 1)",(xmlChar *)0x0,(xmlChar *)0x0,
                 (xmlChar *)0x0);
      pxVar7[1].type = XML_SCHEMA_TYPE_BASIC;
    }
    if (1 < *(int *)&pxVar7[1].field_0x4) {
      in_stack_ffffffffffffff68 = (char *)0x0;
      xmlSchemaPCustomErrExt
                (ctxt,XML_SCHEMAP_COS_ALL_LIMITED,(xmlSchemaBasicItemPtr)0x0,node_01,
                 "Invalid value for maxOccurs (must be 0 or 1)",(xmlChar *)0x0,(xmlChar *)0x0,
                 (xmlChar *)0x0);
      *(undefined4 *)&pxVar7[1].field_0x4 = 1;
    }
    ppxVar8 = &pxVar14->next;
    if (pxVar14 == (xmlSchemaTreeItemPtr_conflict)0x0) {
      ppxVar8 = ppxVar13;
    }
    *ppxVar8 = pxVar7;
    pxVar14 = pxVar7;
  }
  node_01 = node_01->next;
  if (node_01 == (_xmlNode *)0x0) goto LAB_00197f26;
  goto LAB_001977cd;
}

Assistant:

static xmlSchemaTreeItemPtr
xmlSchemaParseModelGroup(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
			 xmlNodePtr node, xmlSchemaTypeType type,
			 int withParticle)
{
    xmlSchemaModelGroupPtr item;
    xmlSchemaParticlePtr particle = NULL;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;
    int min = 1, max = 1, isElemRef, hasRefs = 0;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);
    /*
    * Create a model group with the given compositor.
    */
    item = xmlSchemaAddModelGroup(ctxt, schema, type, node);
    if (item == NULL)
	return (NULL);

    if (withParticle) {
	if (type == XML_SCHEMA_TYPE_ALL) {
	    min = xmlGetMinOccurs(ctxt, node, 0, 1, 1, "(0 | 1)");
	    max = xmlGetMaxOccurs(ctxt, node, 1, 1, 1, "1");
	} else {
	    /* choice + sequence */
	    min = xmlGetMinOccurs(ctxt, node, 0, -1, 1, "xs:nonNegativeInteger");
	    max = xmlGetMaxOccurs(ctxt, node, 0, UNBOUNDED, 1,
		"(xs:nonNegativeInteger | unbounded)");
	}
	xmlSchemaPCheckParticleCorrect_2(ctxt, NULL, node, min, max);
	/*
	* Create a particle
	*/
	particle = xmlSchemaAddParticle(ctxt, node, min, max);
	if (particle == NULL)
	    return (NULL);
	particle->children = (xmlSchemaTreeItemPtr) item;
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if ((!xmlStrEqual(attr->name, BAD_CAST "id")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "maxOccurs")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "minOccurs"))) {
		    xmlSchemaPIllegalAttrErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
    } else {
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if (!xmlStrEqual(attr->name, BAD_CAST "id")) {
		    xmlSchemaPIllegalAttrErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
    }

    /*
    * Extract and validate attributes.
    */
    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    /*
    * And now for the children...
    */
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
        item->annot = xmlSchemaParseAnnotation(ctxt, child, 1);
        child = child->next;
    }
    if (type == XML_SCHEMA_TYPE_ALL) {
	xmlSchemaParticlePtr part, last = NULL;

	while (IS_SCHEMA(child, "element")) {
	    part = (xmlSchemaParticlePtr) xmlSchemaParseElement(ctxt,
		schema, child, &isElemRef, 0);
	    /*
	    * SPEC cos-all-limited (2)
	    * "The {max occurs} of all the particles in the {particles}
	    * of the ('all') group must be 0 or 1.
	    */
	    if (part != NULL) {
		if (isElemRef)
		    hasRefs++;
		if (part->minOccurs > 1) {
		    xmlSchemaPCustomErr(ctxt,
			XML_SCHEMAP_COS_ALL_LIMITED,
			NULL, child,
			"Invalid value for minOccurs (must be 0 or 1)",
			NULL);
		    /* Reset to 1. */
		    part->minOccurs = 1;
		}
		if (part->maxOccurs > 1) {
		    xmlSchemaPCustomErr(ctxt,
			XML_SCHEMAP_COS_ALL_LIMITED,
			NULL, child,
			"Invalid value for maxOccurs (must be 0 or 1)",
			NULL);
		    /* Reset to 1. */
		    part->maxOccurs = 1;
		}
		if (last == NULL)
		    item->children = (xmlSchemaTreeItemPtr) part;
		else
		    last->next = (xmlSchemaTreeItemPtr) part;
		last = part;
	    }
	    child = child->next;
	}
	if (child != NULL) {
	    xmlSchemaPContentErr(ctxt,
		XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child, NULL,
		"(annotation?, (annotation?, element*)");
	}
    } else {
	/* choice + sequence */
	xmlSchemaTreeItemPtr part = NULL, last = NULL;

	while ((IS_SCHEMA(child, "element")) ||
	    (IS_SCHEMA(child, "group")) ||
	    (IS_SCHEMA(child, "any")) ||
	    (IS_SCHEMA(child, "choice")) ||
	    (IS_SCHEMA(child, "sequence"))) {

	    if (IS_SCHEMA(child, "element")) {
		part = (xmlSchemaTreeItemPtr)
		    xmlSchemaParseElement(ctxt, schema, child, &isElemRef, 0);
		if (part && isElemRef)
		    hasRefs++;
	    } else if (IS_SCHEMA(child, "group")) {
		part =
		    xmlSchemaParseModelGroupDefRef(ctxt, schema, child);
		if (part != NULL)
		    hasRefs++;
		/*
		* Handle redefinitions.
		*/
		if (ctxt->isRedefine && ctxt->redef &&
		    (ctxt->redef->item->type == XML_SCHEMA_TYPE_GROUP) &&
		    part && part->children)
		{
		    if ((xmlSchemaGetQNameRefName(part->children) ==
			    ctxt->redef->refName) &&
			(xmlSchemaGetQNameRefTargetNs(part->children) ==
			    ctxt->redef->refTargetNs))
		    {
			/*
			* SPEC src-redefine:
			* (6.1) "If it has a <group> among its contents at
			* some level the `actual value` of whose ref
			* [attribute] is the same as the `actual value` of
			* its own name attribute plus target namespace, then
			* all of the following must be true:"
			* (6.1.1) "It must have exactly one such group."
			*/
			if (ctxt->redefCounter != 0) {
			    xmlChar *str = NULL;

			    xmlSchemaCustomErr(ACTXT_CAST ctxt,
				XML_SCHEMAP_SRC_REDEFINE, child, NULL,
				"The redefining model group definition "
				"'%s' must not contain more than one "
				"reference to the redefined definition",
				xmlSchemaFormatQName(&str,
				    ctxt->redef->refTargetNs,
				    ctxt->redef->refName),
				NULL);
			    FREE_AND_NULL(str)
			    part = NULL;
			} else if (((WXS_PARTICLE(part))->minOccurs != 1) ||
			    ((WXS_PARTICLE(part))->maxOccurs != 1))
			{
			    xmlChar *str = NULL;
			    /*
			    * SPEC src-redefine:
			    * (6.1.2) "The `actual value` of both that
			    * group's minOccurs and maxOccurs [attribute]
			    * must be 1 (or `absent`).
			    */
			    xmlSchemaCustomErr(ACTXT_CAST ctxt,
				XML_SCHEMAP_SRC_REDEFINE, child, NULL,
				"The redefining model group definition "
				"'%s' must not contain a reference to the "
				"redefined definition with a "
				"maxOccurs/minOccurs other than 1",
				xmlSchemaFormatQName(&str,
				    ctxt->redef->refTargetNs,
				    ctxt->redef->refName),
				NULL);
			    FREE_AND_NULL(str)
			    part = NULL;
			}
			ctxt->redef->reference = WXS_BASIC_CAST part;
			ctxt->redefCounter++;
		    }
		}
	    } else if (IS_SCHEMA(child, "any")) {
		part = (xmlSchemaTreeItemPtr)
		    xmlSchemaParseAny(ctxt, schema, child);
	    } else if (IS_SCHEMA(child, "choice")) {
		part = xmlSchemaParseModelGroup(ctxt, schema, child,
		    XML_SCHEMA_TYPE_CHOICE, 1);
	    } else if (IS_SCHEMA(child, "sequence")) {
		part = xmlSchemaParseModelGroup(ctxt, schema, child,
		    XML_SCHEMA_TYPE_SEQUENCE, 1);
	    }
	    if (part != NULL) {
		if (last == NULL)
		    item->children = part;
		else
		    last->next = part;
		last = part;
	    }
	    child = child->next;
	}
	if (child != NULL) {
	    xmlSchemaPContentErr(ctxt,
		XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child, NULL,
		"(annotation?, (element | group | choice | sequence | any)*)");
	}
    }
    if ((max == 0) && (min == 0))
	return (NULL);
    if (hasRefs) {
	/*
	* We need to resolve references.
	*/
	WXS_ADD_PENDING(ctxt, item);
    }
    if (withParticle)
	return ((xmlSchemaTreeItemPtr) particle);
    else
	return ((xmlSchemaTreeItemPtr) item);
}